

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O2

MMFW * MMFW_NewFromFile(char *path,LPStatus *status)

{
  _Bool _Var1;
  int iVar2;
  MMFW *mmfw;
  FILE *file;
  uint32_t *puVar3;
  MMFWEntryName *pacVar4;
  LPStatus LVar5;
  ushort uVar6;
  uint16_t i_1;
  ulong uVar7;
  uint16_t i;
  long lVar8;
  char mmfkind_s [12];
  char name [32];
  
  mmfw = (MMFW *)malloc(0x28);
  if (mmfw == (MMFW *)0x0) {
    *status = LUNAPURPURA_ERROR;
  }
  else {
    file = fopen(path,"rb");
    mmfw->fp = (FILE *)file;
    if (file == (FILE *)0x0) {
      LVar5 = LUNAPURPURA_CANTOPENFILE;
    }
    else {
      _Var1 = ValidateMagicF((FILE *)file,MMFW_MAGIC,4);
      if (_Var1) {
        fread(mmfkind_s,0xc,1,(FILE *)mmfw->fp);
        if (mmfkind_s._0_8_ == 0x73646e756f5320) {
          LVar5 = LUNAPURPURA_ERROR;
LAB_00102699:
          mmfw->kind = LVar5;
          fseek((FILE *)mmfw->fp,4,1);
          fseek((FILE *)mmfw->fp,0xe,1);
          ReadUint16(mmfw->fp,1,&mmfw->n_entries);
          uVar7 = (ulong)mmfw->n_entries;
          puVar3 = (uint32_t *)calloc(uVar7 + 1,4);
          mmfw->offsets = puVar3;
          for (uVar6 = 0; uVar6 <= (ushort)uVar7; uVar6 = uVar6 + 1) {
            ReadUint32(mmfw->fp,1,mmfw->offsets + uVar6);
            uVar7 = (ulong)mmfw->n_entries;
          }
          fseek((FILE *)mmfw->fp,2,1);
          uVar6 = mmfw->n_entries;
          pacVar4 = (MMFWEntryName *)calloc((ulong)uVar6,0x20);
          mmfw->names = pacVar4;
          lVar8 = 0;
          for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
            fread(name,1,0x20,(FILE *)mmfw->fp);
            snprintf(*mmfw->names + lVar8,0x20,"%s",name);
            uVar6 = mmfw->n_entries;
            lVar8 = lVar8 + 0x20;
          }
          lVar8 = ftell((FILE *)mmfw->fp);
          mmfw->kind_metadata_start_pos = lVar8;
          *status = LUNAPURPURA_OK;
          return mmfw;
        }
        iVar2 = bcmp(mmfkind_s," Pictures",10);
        if (iVar2 == 0) {
          LVar5 = LUNAPURPURA_CANTOPENFILE;
          goto LAB_00102699;
        }
        iVar2 = bcmp(mmfkind_s," Films",7);
        LVar5 = LUNAPURPURA_BADMAGIC;
        if (iVar2 == 0) goto LAB_00102699;
      }
      else {
        LVar5 = LUNAPURPURA_BADMAGIC;
      }
    }
    *status = LVar5;
    MMFW_Close(mmfw);
  }
  return (MMFW *)0x0;
}

Assistant:

MMFW *
MMFW_NewFromFile(const char *path, LPStatus *status)
{
	MMFW *mmfw = malloc(sizeof(MMFW));

	if (!mmfw) {
		*status = LUNAPURPURA_ERROR;
		goto fail;
	}

	mmfw->fp = fopen(path, "rb");

	if (!mmfw->fp) {
		*status = LUNAPURPURA_CANTOPENFILE;
		goto fail;
	}

	if (!ValidateMagicF(mmfw->fp, MMFW_MAGIC, MMFW_MAGIC_LEN)) {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	char mmfkind_s[MMFW_KIND_STR_LEN];
	fread(mmfkind_s, MMFW_KIND_STR_LEN, 1, mmfw->fp);

	/* XXX There's probably a better way of doing this. */
	if (!strncmp(mmfkind_s, MMFW_KIND_SOUNDS_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_SOUNDS;
	} else if (!strncmp(mmfkind_s, MMFW_KIND_PICTURES_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_PICTURES;
	} else if (!strncmp(mmfkind_s, MMFW_KIND_FILMS_STR, MMFW_KIND_STR_LEN)) {
		mmfw->kind = MMFW_KIND_FILMS;
	} else {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	fseek(mmfw->fp, 4L, SEEK_CUR); /* [77, 77, 0, 2] */
	fseek(mmfw->fp, 14L, SEEK_CUR); /* not sure */
	ReadUint16(mmfw->fp, 1, &mmfw->n_entries);

	/*
	 * Obtain all the offsets for all the members.
	 *
	 * "+1" because there is one more offset stored in the file than there are
	 * members.  The last offset is always equal to the length of the file, which
	 * will be very helpful to know later on.
	 */
	mmfw->offsets = calloc(mmfw->n_entries+1, sizeof(uint32_t));

	for (uint16_t i = 0; i < (mmfw->n_entries+1); i++) {
		ReadUint32(mmfw->fp, 1, &(mmfw->offsets[i]));
	}

	fseek(mmfw->fp, 2L, SEEK_CUR); /* zeroes */

	/* Obtain the names of all the members. */
	char name[MMFW_ENTRY_NAME_LEN];

	mmfw->names = calloc(mmfw->n_entries, sizeof(MMFWEntryName));

	for (uint16_t i = 0; i < mmfw->n_entries; i++) {
		fread(name, 1, sizeof(name), mmfw->fp);
		snprintf(mmfw->names[i], MMFW_ENTRY_NAME_LEN, "%s", name);
	}

	/*
	 * What follows is metadata that is specific to the various kinds of MMFW
	 * archive. So let's keep track of our current file position.
	 */
	mmfw->kind_metadata_start_pos = ftell(mmfw->fp);

	*status = LUNAPURPURA_OK;
	return mmfw;

fail:
	if (mmfw) MMFW_Close(mmfw);
	return NULL;
}